

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# candump.c
# Opt level: O0

int main(int argc,char **argv)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  size_t sVar6;
  time_t tVar7;
  int *piVar8;
  ssize_t sVar9;
  char *pcVar10;
  char **in_RSI;
  int in_EDI;
  __u32 frames;
  timespec *stamp;
  char *extra_info;
  int idx;
  if_info *obj_1;
  tm now;
  time_t currtime;
  int dropmonitor_on;
  int timestamp_on;
  int timestamping_flags;
  socklen_t curr_rcvbuf_size_len;
  int curr_rcvbuf_size;
  if_info *obj;
  char *logname;
  char fname [83];
  FILE *logfile;
  int timeout_ms;
  timeval last_tv;
  timeval tv;
  ifreq ifr;
  int i;
  int nbytes;
  can_err_mask_t err_mask;
  can_filter *rfilter;
  cmsghdr *cmsg;
  msghdr msg;
  iovec iov;
  char ctrlmsg [120];
  can_raw_vcid_options vcid_opts;
  sockaddr_can addr;
  char *nptr;
  char *ptr;
  int join_filter;
  int numfilter;
  int currmax;
  int num_events;
  int opt;
  int rcvbuf_size;
  int count;
  uchar logfrmt;
  uchar log;
  uchar view;
  uchar color;
  uchar silentani;
  uchar silent;
  uchar extra_msg_info;
  uchar dropmonitor;
  uchar down_causes_exit;
  uchar hwtimestamp;
  uchar logtimestamp;
  uchar timestamp;
  epoll_event event_setup;
  epoll_event events_pending [16];
  int fd_epoll;
  char (*local_3a0) [19];
  char (*sep) [19];
  undefined4 in_stack_fffffffffffffc78;
  uint in_stack_fffffffffffffc7c;
  cmsghdr *in_stack_fffffffffffffc80;
  cu_t *in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc90;
  uint in_stack_fffffffffffffc94;
  cmsghdr *in_stack_fffffffffffffc98;
  char *local_360;
  int local_348;
  int local_344;
  int local_340;
  uint local_33c;
  int in_stack_fffffffffffffcc8;
  int in_stack_fffffffffffffccc;
  timeval *in_stack_fffffffffffffcd0;
  char in_stack_fffffffffffffcdf;
  char *in_stack_fffffffffffffce0;
  time_t local_310;
  sockaddr *local_308;
  undefined4 local_2fc;
  undefined4 local_2f8;
  undefined4 local_2f4;
  socklen_t local_2f0;
  int local_2ec;
  if_info *local_2e8;
  char *local_2e0;
  char local_2d8 [96];
  FILE *local_278;
  int local_26c;
  undefined8 local_268;
  undefined8 local_260;
  size_t local_258;
  long local_250;
  char local_248 [16];
  undefined4 local_238;
  uint local_21c;
  uint local_218;
  int local_214;
  void *local_210;
  cmsghdr *local_208;
  msghdr local_200;
  iovec local_1c8;
  cmsghdr local_1b8 [7];
  undefined4 local_13c;
  sockaddr local_138;
  undefined8 local_128;
  char *local_120;
  char *local_118;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  char local_f0;
  char local_ef;
  byte local_ee;
  byte local_ed;
  byte local_ec;
  byte local_eb;
  char local_ea;
  char local_e9;
  char local_e8;
  char local_e7;
  char local_e6;
  char local_e5;
  undefined1 local_e4 [16];
  undefined8 auStack_d4 [24];
  int local_14;
  char **local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_e4._0_4_ = 1;
  local_e4._4_4_ = 0;
  local_e4._8_4_ = 0;
  local_e5 = '\0';
  local_e6 = 'a';
  local_e7 = '\0';
  local_e8 = '\x01';
  local_e9 = '\0';
  local_ea = '\0';
  local_eb = 0x2a;
  local_ec = 0;
  local_ed = 0;
  local_ee = 0;
  local_ef = '\0';
  local_f0 = '\0';
  local_f4 = 0;
  local_f8 = 0;
  local_138.sa_family = 0x1d;
  local_138.sa_data[0] = '\0';
  local_138.sa_data[1] = '\0';
  local_138.sa_data[2] = '\0';
  local_138.sa_data[3] = '\0';
  local_138.sa_data[4] = '\0';
  local_138.sa_data[5] = '\0';
  local_138.sa_data[6] = '\0';
  local_138.sa_data[7] = '\0';
  local_138.sa_data[8] = '\0';
  local_138.sa_data[9] = '\0';
  local_138.sa_data[10] = '\0';
  local_138.sa_data[0xb] = '\0';
  local_138.sa_data[0xc] = '\0';
  local_138.sa_data[0xd] = '\0';
  local_128 = 0;
  local_13c = 4;
  local_26c = -1;
  local_278 = (FILE *)0x0;
  local_2e0 = (char *)0x0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  signal(0xf,sigterm);
  signal(1,sigterm);
  signal(2,sigterm);
  local_268 = 0;
  local_260 = 0;
  progname = __xpg_basename(*local_10);
  while (local_fc = getopt(local_8,local_10,"t:HciaSs:lf:Ln:r:Dde8xT:h?"), local_fc != -1) {
    in_stack_fffffffffffffc88 = (cu_t *)(ulong)(local_fc - 0x38);
    switch(in_stack_fffffffffffffc88) {
    case (cu_t *)0x0:
      local_ee = local_ee | 0x20;
      break;
    default:
      print_usage();
      exit(1);
    case (cu_t *)0xc:
      local_e8 = '\0';
      break;
    case (cu_t *)0x10:
      local_e7 = '\x01';
      break;
    case (cu_t *)0x14:
      local_f0 = '\x01';
      break;
    case (cu_t *)0x1b:
      local_ee = local_ee | 4;
      break;
    case (cu_t *)0x1c:
      piVar8 = __errno_location();
      *piVar8 = 0;
      lVar5 = strtol(_optarg,(char **)0x0,0);
      local_26c = (int)lVar5;
      piVar8 = __errno_location();
      if (*piVar8 != 0) {
        print_usage();
        exit(1);
      }
      break;
    case (cu_t *)0x29:
      local_ee = local_ee | 1;
      break;
    case (cu_t *)0x2b:
      local_ed = local_ed + 1;
      break;
    case (cu_t *)0x2c:
      local_e9 = '\x01';
      break;
    case (cu_t *)0x2d:
      local_ee = local_ee | 8;
      break;
    case (cu_t *)0x2e:
      local_2e0 = _optarg;
      local_ef = '\x01';
      break;
    case (cu_t *)0x31:
      local_ee = local_ee | 2;
      break;
    case (cu_t *)0x34:
      local_ef = '\x01';
      break;
    case (cu_t *)0x36:
      local_f4 = atoi(_optarg);
      if (local_f4 < 1) {
        print_usage();
        exit(1);
      }
      break;
    case (cu_t *)0x3a:
      local_f8 = atoi(_optarg);
      if (local_f8 < 1) {
        print_usage();
        exit(1);
      }
      break;
    case (cu_t *)0x3b:
      iVar3 = atoi(_optarg);
      local_eb = (byte)iVar3;
      if (2 < local_eb) {
        print_usage();
        exit(1);
      }
      break;
    case (cu_t *)0x3c:
      local_e5 = *_optarg;
      local_e6 = *_optarg;
      if ((((local_e5 != 'a') && (local_e5 != 'A')) && (local_e5 != 'd')) && (local_e5 != 'z')) {
        fprintf(_stderr,"%s: unknown timestamp mode \'%c\' - ignored\n",progname,
                (ulong)(uint)(int)*_optarg);
        local_e5 = '\0';
      }
      if ((local_e6 != 'a') && (local_e6 != 'z')) {
        local_e6 = 'a';
      }
      break;
    case (cu_t *)0x40:
      local_ea = '\x01';
    }
  }
  if (_optind == local_8) {
    print_usage();
    exit(0);
  }
  if ((local_f0 != '\0') && (local_ee != 0)) {
    fprintf(_stderr,"Log file format selected: Please disable ASCII/BINARY/SWAP/RAWDLC options!\n");
    exit(0);
  }
  if (((local_ef != '\0') && (local_2e0 != (char *)0x0)) &&
     (iVar3 = strcmp("-",local_2e0), iVar3 == 0)) {
    local_ef = '\0';
    local_f0 = '\x01';
  }
  if (local_eb == 0x2a) {
    if (local_ef == '\0') {
      local_eb = 0;
    }
    else {
      fprintf(_stderr,"Disabled standard output while logging.\n");
      local_eb = 2;
    }
  }
  local_104 = local_8 - _optind;
  if (local_104 < 0x11) {
    local_14 = epoll_create(1);
    if (local_14 < 0) {
      perror("epoll_create");
      local_4 = 1;
    }
    else {
      for (local_21c = 0; (int)local_21c < local_104; local_21c = local_21c + 1) {
        local_2e8 = sock_info + (int)local_21c;
        local_118 = local_10[(int)(_optind + local_21c)];
        local_120 = strchr(local_118,0x2c);
        pr_debug("open %d \'%s\'.\n",(ulong)local_21c,local_118);
        iVar3 = socket(0x1d,3,1);
        local_2e8->s = iVar3;
        if (local_2e8->s < 0) {
          perror("socket");
          return 1;
        }
        local_e4._4_4_ = SUB84(local_2e8,0);
        local_e4._8_4_ = (undefined4)((ulong)local_2e8 >> 0x20);
        iVar3 = epoll_ctl(local_14,1,local_2e8->s,(epoll_event *)local_e4);
        if (iVar3 != 0) {
          perror("failed to add socket to epoll");
          return 1;
        }
        local_2e8->cmdlinename = local_118;
        if (local_120 == (char *)0x0) {
          sVar6 = strlen(local_118);
          local_218 = (uint)sVar6;
        }
        else {
          local_218 = (int)local_120 - (int)local_118;
        }
        if (0xf < (int)local_218) {
          fprintf(_stderr,"name of CAN device \'%s\' is too long!\n",local_118);
          return 1;
        }
        if (max_devname_len < (int)local_218) {
          max_devname_len = local_218;
        }
        memset(local_248,0,0x10);
        strncpy(local_248,local_118,(long)(int)local_218);
        pr_debug("using interface name \'%s\'.\n",local_248);
        iVar3 = strcmp("any",local_248);
        if (iVar3 == 0) {
          local_138._0_8_ = local_138._0_8_ & 0xffffffff;
        }
        else {
          iVar3 = ioctl(local_2e8->s,0x8933,local_248);
          if (iVar3 < 0) {
            perror("SIOCGIFINDEX");
            exit(1);
          }
          local_138.sa_data._2_4_ = local_238;
        }
        if (local_120 != (char *)0x0) {
          local_108 = 0;
          for (local_118 = local_120; local_118 != (char *)0x0; local_118 = strchr(local_118,0x2c))
          {
            local_108 = local_108 + 1;
            local_118 = local_118 + 1;
          }
          local_210 = malloc((long)local_108 << 3);
          if (local_210 == (void *)0x0) {
            fprintf(_stderr,"Failed to create filter space!\n");
            return 1;
          }
          local_108 = 0;
          local_214 = 0;
          local_10c = 0;
          while (local_120 != (char *)0x0) {
            local_118 = local_120 + 1;
            local_120 = strchr(local_118,0x2c);
            iVar3 = __isoc99_sscanf(local_118,"%x:%x",
                                    (void *)((long)local_210 + (long)local_108 * 8),
                                    (long)local_210 + (long)local_108 * 8 + 4);
            if (iVar3 == 2) {
              *(uint *)((long)local_210 + (long)local_108 * 8 + 4) =
                   *(uint *)((long)local_210 + (long)local_108 * 8 + 4) & 0xdfffffff;
              if (local_118[8] == ':') {
                *(uint *)((long)local_210 + (long)local_108 * 8) =
                     *(uint *)((long)local_210 + (long)local_108 * 8) | 0x80000000;
              }
              local_108 = local_108 + 1;
            }
            else {
              iVar3 = __isoc99_sscanf(local_118,"%x~%x",
                                      (void *)((long)local_210 + (long)local_108 * 8),
                                      (long)local_210 + (long)local_108 * 8 + 4);
              if (iVar3 == 2) {
                *(uint *)((long)local_210 + (long)local_108 * 8) =
                     *(uint *)((long)local_210 + (long)local_108 * 8) | 0x20000000;
                *(uint *)((long)local_210 + (long)local_108 * 8 + 4) =
                     *(uint *)((long)local_210 + (long)local_108 * 8 + 4) & 0xdfffffff;
                if (local_118[8] == '~') {
                  *(uint *)((long)local_210 + (long)local_108 * 8) =
                       *(uint *)((long)local_210 + (long)local_108 * 8) | 0x80000000;
                }
                local_108 = local_108 + 1;
              }
              else if ((*local_118 == 'j') || (*local_118 == 'J')) {
                local_10c = 1;
              }
              else {
                iVar3 = __isoc99_sscanf(local_118,"#%x",&local_214);
                if (iVar3 != 1) {
                  fprintf(_stderr,"Error in filter option parsing: \'%s\'\n",local_118);
                  return 1;
                }
              }
            }
          }
          if (local_214 != 0) {
            setsockopt(local_2e8->s,0x65,2,&local_214,4);
          }
          if ((local_10c != 0) && (iVar3 = setsockopt(local_2e8->s,0x65,6,&local_10c,4), iVar3 < 0))
          {
            perror("setsockopt CAN_RAW_JOIN_FILTERS not supported by your Linux Kernel");
            return 1;
          }
          if (local_108 != 0) {
            setsockopt(local_2e8->s,0x65,1,local_210,local_108 << 3);
          }
          free(local_210);
        }
        setsockopt(local_2e8->s,0x65,5,&canfx_on,4);
        setsockopt(local_2e8->s,0x65,7,&canfx_on,4);
        setsockopt(local_2e8->s,0x65,8,&local_13c,4);
        if (local_f8 != 0) {
          local_2f0 = 4;
          iVar3 = setsockopt(local_2e8->s,1,0x21,&local_f8,4);
          if (iVar3 < 0) {
            pr_debug("SO_RCVBUFFORCE failed so try SO_RCVBUF ...\n");
            iVar3 = setsockopt(local_2e8->s,1,8,&local_f8,4);
            if (iVar3 < 0) {
              perror("setsockopt SO_RCVBUF");
              return 1;
            }
            iVar3 = getsockopt(local_2e8->s,1,8,&local_2ec,&local_2f0);
            if (iVar3 < 0) {
              perror("getsockopt SO_RCVBUF");
              return 1;
            }
            if ((local_21c == 0) &&
               (SBORROW4(local_2ec,local_f8 * 2) != local_2ec + local_f8 * -2 < 0)) {
              fprintf(_stderr,
                      "The socket receive buffer size was adjusted due to /proc/sys/net/core/rmem_max.\n"
                     );
            }
          }
        }
        if (((local_e5 != '\0') || (local_ef != '\0')) || (local_f0 != '\0')) {
          if (local_e7 == '\0') {
            local_2f8 = 1;
            iVar3 = setsockopt(local_2e8->s,1,0x1d,&local_2f8,4);
            if (iVar3 < 0) {
              perror("setsockopt SO_TIMESTAMP");
              return 1;
            }
          }
          else {
            local_2f4 = 0x58;
            iVar3 = setsockopt(local_2e8->s,1,0x25,&local_2f4,4);
            if (iVar3 < 0) {
              perror("setsockopt SO_TIMESTAMPING is not supported by your Linux kernel");
              return 1;
            }
          }
        }
        if (local_e9 != '\0') {
          local_2fc = 1;
          iVar3 = setsockopt(local_2e8->s,1,0x28,&local_2fc,4);
          if (iVar3 < 0) {
            perror("setsockopt SO_RXQ_OVFL not supported by your Linux Kernel");
            return 1;
          }
        }
        local_308 = &local_138;
        iVar3 = bind(local_2e8->s,local_308,0x18);
        if (iVar3 < 0) {
          perror("bind");
          return 1;
        }
      }
      if (local_ef != '\0') {
        if (local_2e0 == (char *)0x0) {
          tVar7 = time(&local_310);
          if (tVar7 == -1) {
            perror("time");
            return 1;
          }
          localtime_r(&local_310,(tm *)&local_348);
          snprintf(local_2d8,0x53,"candump-%04d-%02d-%02d_%02d%02d%02d.log",
                   (ulong)(in_stack_fffffffffffffccc + 0x76c),(ulong)(in_stack_fffffffffffffcc8 + 1)
                   ,(ulong)local_33c,local_340,local_344,local_348);
          local_2e0 = local_2d8;
        }
        if (local_eb != 2) {
          fprintf(_stderr,"Warning: Console output active while logging!\n");
        }
        fprintf(_stderr,"Enabling Logfile \'%s\'\n",local_2e0);
        local_278 = fopen(local_2e0,"w");
        if (local_278 == (FILE *)0x0) {
          perror("logfile");
          return 1;
        }
      }
      local_1c8.iov_base = &main::cu;
      local_200.msg_name = &local_138;
      local_200.msg_iov = &local_1c8;
      local_200.msg_iovlen = 1;
      local_200.msg_control = local_1b8;
      while (running != 0) {
        local_100 = epoll_wait(local_14,(epoll_event *)(local_e4 + 0xc),local_104,local_26c);
        if (local_100 == -1) {
          piVar8 = __errno_location();
          if (*piVar8 != 4) {
            running = 0;
          }
        }
        else if ((local_100 == 0) && (-1 < local_26c)) {
          running = 0;
        }
        else {
          for (local_21c = 0; (int)local_21c < local_100; local_21c = local_21c + 1) {
            piVar8 = *(int **)((long)auStack_d4 + (long)(int)local_21c * 0xc);
            local_360 = "";
            local_1c8.iov_len = 0x810;
            local_200.msg_namelen = 0x18;
            local_200.msg_controllen = 0x78;
            local_200.msg_flags = 0;
            sVar9 = recvmsg(*piVar8,&local_200,0);
            local_218 = (uint)sVar9;
            iVar3 = idx2dindex((int)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
            if ((int)local_218 < 0) {
              piVar8 = __errno_location();
              if ((*piVar8 != 100) || (local_e8 != '\0')) {
                perror("read");
                return 1;
              }
              fprintf(_stderr,"%s: interface down\n",devname + iVar3);
            }
            else {
              if ((int)local_218 < 0xd) {
                fprintf(_stderr,"read: no CAN frame\n");
                return 1;
              }
              if ((main::cu.fd.len & 0x80) == 0) {
                if (local_218 == 0x10) {
                  main::cu.cc.__pad = '\0';
                }
                else {
                  if (local_218 != 0x48) {
                    fprintf(_stderr,"read: incomplete CAN CC/FD frame\n");
                    return 1;
                  }
                  main::cu.cc.__pad = main::cu.cc.__pad | 4;
                }
              }
              else if (local_218 != main::cu.xl.len + 0xc) {
                printf("nbytes = %d\n",(ulong)local_218);
                fprintf(_stderr,"read: no CAN XL frame\n");
                return 1;
              }
              if ((local_f4 != 0) && (local_f4 = local_f4 + -1, local_f4 == 0)) {
                running = 0;
              }
              in_stack_fffffffffffffc80 = (cmsghdr *)local_200.msg_control;
              local_208 = (cmsghdr *)local_200.msg_control;
              if (local_200.msg_controllen < 0x10) {
                local_208 = (cmsghdr *)0x0;
                in_stack_fffffffffffffc80 = local_208;
              }
              while( true ) {
                uVar2 = in_stack_fffffffffffffc7c & 0xffffff;
                if (local_208 != (cmsghdr *)0x0) {
                  uVar2 = CONCAT13(local_208->cmsg_level == 1,(int3)in_stack_fffffffffffffc7c);
                }
                in_stack_fffffffffffffc7c = uVar2;
                if ((char)(in_stack_fffffffffffffc7c >> 0x18) == '\0') break;
                if (local_208->cmsg_type == 0x1d) {
                  local_258 = local_208[1].cmsg_len;
                  local_250._0_4_ = local_208[1].cmsg_level;
                  local_250._4_4_ = local_208[1].cmsg_type;
                }
                else if (local_208->cmsg_type == 0x25) {
                  in_stack_fffffffffffffc98 = local_208 + 1;
                  local_258 = local_208[3].cmsg_len;
                  local_250 = *(long *)&local_208[3].cmsg_level / 1000;
                }
                else if (local_208->cmsg_type == 0x28) {
                  piVar8[4] = (int)local_208[1].cmsg_len;
                }
                local_208 = __cmsg_nxthdr(&local_200,local_208);
              }
              if (piVar8[4] != piVar8[5]) {
                in_stack_fffffffffffffc94 = piVar8[4] - piVar8[5];
                if (local_eb != 2) {
                  pcVar10 = "";
                  if (1 < in_stack_fffffffffffffc94) {
                    pcVar10 = "s";
                  }
                  printf("DROPCOUNT: dropped %u CAN frame%s on \'%s\' socket (total drops %u)\n",
                         (ulong)in_stack_fffffffffffffc94,pcVar10,devname + iVar3,
                         (ulong)(uint)piVar8[4]);
                }
                if (local_ef != '\0') {
                  pcVar10 = "";
                  if (1 < in_stack_fffffffffffffc94) {
                    pcVar10 = "s";
                  }
                  fprintf(local_278,
                          "DROPCOUNT: dropped %u CAN frame%s on \'%s\' socket (total drops %u)\n",
                          (ulong)in_stack_fffffffffffffc94,pcVar10,devname + iVar3,
                          (ulong)(uint)piVar8[4]);
                }
                piVar8[5] = piVar8[4];
              }
              if ((main::cu.cc.can_id & 0x80000000) != 0) {
                local_ee = local_ee | 0x10;
              }
              if (local_ea != '\0') {
                if ((local_200.msg_flags & 4U) == 0) {
                  local_360 = " R";
                }
                else {
                  local_360 = " T";
                }
              }
              if ((local_ef != '\0') || ((local_f0 != '\0' && (local_eb == 0)))) {
                main::alen = sprint_timestamp(in_stack_fffffffffffffce0,in_stack_fffffffffffffcdf,
                                              in_stack_fffffffffffffcd0,
                                              (timeval *)
                                              CONCAT44(in_stack_fffffffffffffccc,
                                                       in_stack_fffffffffffffcc8));
                iVar4 = sprintf(main::afrbuf + main::alen,"%*s ",(ulong)(uint)max_devname_len,
                                devname + iVar3);
                main::alen = iVar4 + main::alen;
                iVar4 = snprintf_canframe((char *)in_stack_fffffffffffffc98,
                                          CONCAT44(in_stack_fffffffffffffc94,
                                                   in_stack_fffffffffffffc90),
                                          in_stack_fffffffffffffc88,
                                          (int)((ulong)in_stack_fffffffffffffc80 >> 0x20));
                main::alen = iVar4 + main::alen;
              }
              if (local_ef != '\0') {
                fprintf(local_278,"%s%s\n",main::afrbuf,local_360);
              }
              if ((local_f0 == '\0') || (local_eb != 0)) {
                if (local_eb == 0) {
                  if (local_ed < 3) {
                    sep = (char (*) [19])0x107677;
                  }
                  else {
                    sep = col_on + iVar3 % 6;
                  }
                  main::alen = sprintf(main::afrbuf," %s",sep);
                  iVar4 = sprint_timestamp(in_stack_fffffffffffffce0,in_stack_fffffffffffffcdf,
                                           in_stack_fffffffffffffcd0,
                                           (timeval *)
                                           CONCAT44(in_stack_fffffffffffffccc,
                                                    in_stack_fffffffffffffcc8));
                  main::alen = iVar4 + main::alen;
                  if ((local_ed == 0) || (2 < local_ed)) {
                    local_3a0 = (char (*) [19])0x107677;
                  }
                  else {
                    local_3a0 = col_on + iVar3 % 6;
                  }
                  iVar3 = sprintf(main::afrbuf + main::alen," %s%*s",local_3a0,
                                  (ulong)(uint)max_devname_len,devname + iVar3);
                  main::alen = iVar3 + main::alen;
                  if (local_ea != '\0') {
                    if ((local_200.msg_flags & 4U) == 0) {
                      iVar3 = sprintf(main::afrbuf + main::alen,"  RX %s",
                                      extra_m_info + (int)(main::cu.cc.__pad & 3));
                      main::alen = iVar3 + main::alen;
                    }
                    else {
                      iVar3 = sprintf(main::afrbuf + main::alen,"  TX %s",
                                      extra_m_info + (int)(main::cu.cc.__pad & 3));
                      main::alen = iVar3 + main::alen;
                    }
                  }
                  pcVar10 = "";
                  if (local_ed == 1) {
                    pcVar10 = "\x1b[0m";
                  }
                  iVar3 = sprintf(main::afrbuf + main::alen,"%s  ",pcVar10);
                  main::alen = iVar3 + main::alen;
                  iVar3 = snprintf_long_canframe
                                    (in_stack_fffffffffffffc88->field3,
                                     (size_t)in_stack_fffffffffffffc80,
                                     (cu_t *)CONCAT44(in_stack_fffffffffffffc7c,
                                                      in_stack_fffffffffffffc78),
                                     (int)((ulong)sep >> 0x20));
                  main::alen = iVar3 + main::alen;
                  if (((local_ee & 8) != 0) && ((main::cu.cc.can_id & 0x20000000) != 0)) {
                    iVar3 = sprintf(main::afrbuf + main::alen,"\n\t");
                    main::alen = iVar3 + main::alen;
                    iVar3 = snprintf_can_error_frame
                                      (in_stack_fffffffffffffc88->field3,
                                       (size_t)in_stack_fffffffffffffc80,
                                       (canfd_frame *)
                                       CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78)
                                       ,*sep);
                    main::alen = iVar3 + main::alen;
                  }
                  pcVar10 = "";
                  if (1 < local_ed) {
                    pcVar10 = "\x1b[0m";
                  }
                  printf("%s%s\n",main::afrbuf,pcVar10);
                }
                else if (local_eb == 1) {
                  uVar1 = (ulong)local_ec;
                  local_ec = (byte)(uVar1 % 4);
                  printf("%c\b",(ulong)(uint)(int)"|/-\\"[uVar1 % 4]);
                  local_ec = local_ec + 1;
                }
              }
              else {
                printf("%s%s\n",main::afrbuf,local_360);
              }
              fflush(_stdout);
            }
          }
        }
      }
      for (local_21c = 0; (int)local_21c < local_104; local_21c = local_21c + 1) {
        close(sock_info[(int)local_21c].s);
      }
      close(local_14);
      if (local_ef != '\0') {
        fclose(local_278);
      }
      if (signal_num == 0) {
        local_4 = 0;
      }
      else {
        local_4 = signal_num + 0x80;
      }
    }
  }
  else {
    fprintf(_stderr,"More than %d CAN devices given on commandline!\n",0x10);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char **argv)
{
	int fd_epoll;
	struct epoll_event events_pending[MAXSOCK];
	struct epoll_event event_setup = {
		.events = EPOLLIN, /* prepare the common part */
	};
	unsigned char timestamp = 0;
	unsigned char logtimestamp = 'a';
	unsigned char hwtimestamp = 0;
	unsigned char down_causes_exit = 1;
	unsigned char dropmonitor = 0;
	unsigned char extra_msg_info = 0;
	unsigned char silent = SILENT_INI;
	unsigned char silentani = 0;
	unsigned char color = 0;
	unsigned char view = 0;
	unsigned char log = 0;
	unsigned char logfrmt = 0;
	int count = 0;
	int rcvbuf_size = 0;
	int opt, num_events;
	int currmax, numfilter;
	int join_filter;
	char *ptr, *nptr;
	struct sockaddr_can addr = {
		.can_family = AF_CAN,
	};
	struct can_raw_vcid_options vcid_opts = {
		.flags = CAN_RAW_XL_VCID_RX_FILTER,
		.rx_vcid = 0,
		.rx_vcid_mask = 0,
	};
	char ctrlmsg[CMSG_SPACE(sizeof(struct timeval)) +
		     CMSG_SPACE(3 * sizeof(struct timespec)) +
		     CMSG_SPACE(sizeof(__u32))];
	struct iovec iov;
	struct msghdr msg;
	struct cmsghdr *cmsg;
	struct can_filter *rfilter;
	can_err_mask_t err_mask;
	static cu_t cu; /* union for CAN CC/FD/XL frames */
	int nbytes, i;
	struct ifreq ifr;
	struct timeval tv, last_tv;
	int timeout_ms = -1; /* default to no timeout */
	FILE *logfile = NULL;
	char fname[83]; /* suggested by -Wformat-overflow= */
	const char *logname = NULL;
	static char afrbuf[AFRSZ]; /* ASCII CAN frame buffer size */
	static int alen;

	signal(SIGTERM, sigterm);
	signal(SIGHUP, sigterm);
	signal(SIGINT, sigterm);

	last_tv.tv_sec = 0;
	last_tv.tv_usec = 0;

	progname = basename(argv[0]);

	while ((opt = getopt(argc, argv, "t:HciaSs:lf:Ln:r:Dde8xT:h?")) != -1) {
		switch (opt) {
		case 't':
			timestamp = optarg[0];
			logtimestamp = optarg[0];
			if ((timestamp != 'a') && (timestamp != 'A') &&
			    (timestamp != 'd') && (timestamp != 'z')) {
				fprintf(stderr, "%s: unknown timestamp mode '%c' - ignored\n",
					progname, optarg[0]);
				timestamp = 0;
			}
			if ((logtimestamp != 'a') && (logtimestamp != 'z')) {
				logtimestamp = 'a';
			}
			break;

		case 'H':
			hwtimestamp = 1;
			break;

		case 'c':
			color++;
			break;

		case 'i':
			view |= CANLIB_VIEW_BINARY;
			break;

		case 'a':
			view |= CANLIB_VIEW_ASCII;
			break;

		case 'S':
			view |= CANLIB_VIEW_SWAP;
			break;

		case 'e':
			view |= CANLIB_VIEW_ERROR;
			break;

		case '8':
			view |= CANLIB_VIEW_LEN8_DLC;
			break;

		case 's':
			silent = atoi(optarg);
			if (silent > SILENT_ON) {
				print_usage();
				exit(1);
			}
			break;

		case 'l':
			log = 1;
			break;

		case 'D':
			down_causes_exit = 0;
			break;

		case 'd':
			dropmonitor = 1;
			break;

		case 'x':
			extra_msg_info = 1;
			break;

		case 'L':
			logfrmt = 1;
			break;

		case 'f':
			logname = optarg;
			log = 1;
			break;

		case 'n':
			count = atoi(optarg);
			if (count < 1) {
				print_usage();
				exit(1);
			}
			break;

		case 'r':
			rcvbuf_size = atoi(optarg);
			if (rcvbuf_size < 1) {
				print_usage();
				exit(1);
			}
			break;

		case 'T':
			errno = 0;
			timeout_ms = strtol(optarg, NULL, 0);
			if (errno != 0) {
				print_usage();
				exit(1);
			}
			break;
		default:
			print_usage();
			exit(1);
			break;
		}
	}

	if (optind == argc) {
		print_usage();
		exit(0);
	}

	if (logfrmt && view) {
		fprintf(stderr, "Log file format selected: Please disable ASCII/BINARY/SWAP/RAWDLC options!\n");
		exit(0);
	}

	/* "-f -"  is equal to "-L" (print logfile format on stdout) */
	if (log && logname && strcmp("-", logname) == 0) {
		log = 0; /* no logging into a file */
		logfrmt = 1; /* print logformat output to stdout */
	}

	if (silent == SILENT_INI) {
		if (log) {
			fprintf(stderr, "Disabled standard output while logging.\n");
			silent = SILENT_ON; /* disable output on stdout */
		} else
			silent = SILENT_OFF; /* default output */
	}

	currmax = argc - optind; /* find real number of CAN devices */

	if (currmax > MAXSOCK) {
		fprintf(stderr, "More than %d CAN devices given on commandline!\n", MAXSOCK);
		return 1;
	}

	fd_epoll = epoll_create(1);
	if (fd_epoll < 0) {
		perror("epoll_create");
		return 1;
	}

	for (i = 0; i < currmax; i++) {
		struct if_info *obj = &sock_info[i];
		ptr = argv[optind + i];
		nptr = strchr(ptr, ',');

		pr_debug("open %d '%s'.\n", i, ptr);

		obj->s = socket(PF_CAN, SOCK_RAW, CAN_RAW);
		if (obj->s < 0) {
			perror("socket");
			return 1;
		}

		event_setup.data.ptr = obj; /* remember the instance as private data */
		if (epoll_ctl(fd_epoll, EPOLL_CTL_ADD, obj->s, &event_setup)) {
			perror("failed to add socket to epoll");
			return 1;
		}

		obj->cmdlinename = ptr; /* save pointer to cmdline name of this socket */

		if (nptr)
			nbytes = nptr - ptr; /* interface name is up the first ',' */
		else
			nbytes = strlen(ptr); /* no ',' found => no filter definitions */

		if (nbytes >= IFNAMSIZ) {
			fprintf(stderr, "name of CAN device '%s' is too long!\n", ptr);
			return 1;
		}

		if (nbytes > max_devname_len)
			max_devname_len = nbytes; /* for nice printing */

		memset(&ifr.ifr_name, 0, sizeof(ifr.ifr_name));
		strncpy(ifr.ifr_name, ptr, nbytes);

		pr_debug("using interface name '%s'.\n", ifr.ifr_name);

		if (strcmp(ANYDEV, ifr.ifr_name) != 0) {
			if (ioctl(obj->s, SIOCGIFINDEX, &ifr) < 0) {
				perror("SIOCGIFINDEX");
				exit(1);
			}
			addr.can_ifindex = ifr.ifr_ifindex;
		} else
			addr.can_ifindex = 0; /* any can interface */

		if (nptr) {
			/* found a ',' after the interface name => check for filters */

			/* determine number of filters to alloc the filter space */
			numfilter = 0;
			ptr = nptr;
			while (ptr) {
				numfilter++;
				ptr++; /* hop behind the ',' */
				ptr = strchr(ptr, ','); /* exit condition */
			}

			rfilter = malloc(sizeof(struct can_filter) * numfilter);
			if (!rfilter) {
				fprintf(stderr, "Failed to create filter space!\n");
				return 1;
			}

			numfilter = 0;
			err_mask = 0;
			join_filter = 0;

			while (nptr) {

				ptr = nptr + 1; /* hop behind the ',' */
				nptr = strchr(ptr, ','); /* update exit condition */

				if (sscanf(ptr, "%x:%x",
					   &rfilter[numfilter].can_id,
					   &rfilter[numfilter].can_mask) == 2) {
					rfilter[numfilter].can_mask &= ~CAN_ERR_FLAG;
					if (*(ptr + 8) == ':')
						rfilter[numfilter].can_id |= CAN_EFF_FLAG;
					numfilter++;
				} else if (sscanf(ptr, "%x~%x",
						  &rfilter[numfilter].can_id,
						  &rfilter[numfilter].can_mask) == 2) {
					rfilter[numfilter].can_id |= CAN_INV_FILTER;
					rfilter[numfilter].can_mask &= ~CAN_ERR_FLAG;
					if (*(ptr + 8) == '~')
						rfilter[numfilter].can_id |= CAN_EFF_FLAG;
					numfilter++;
				} else if (*ptr == 'j' || *ptr == 'J') {
					join_filter = 1;
				} else if (sscanf(ptr, "#%x", &err_mask) != 1) {
					fprintf(stderr, "Error in filter option parsing: '%s'\n", ptr);
					return 1;
				}
			}

			if (err_mask)
				setsockopt(obj->s, SOL_CAN_RAW, CAN_RAW_ERR_FILTER,
					   &err_mask, sizeof(err_mask));

			if (join_filter && setsockopt(obj->s, SOL_CAN_RAW, CAN_RAW_JOIN_FILTERS,
						      &join_filter, sizeof(join_filter)) < 0) {
				perror("setsockopt CAN_RAW_JOIN_FILTERS not supported by your Linux Kernel");
				return 1;
			}

			if (numfilter)
				setsockopt(obj->s, SOL_CAN_RAW, CAN_RAW_FILTER,
					   rfilter, numfilter * sizeof(struct can_filter));

			free(rfilter);

		} /* if (nptr) */

		/* try to switch the socket into CAN FD mode */
		setsockopt(obj->s, SOL_CAN_RAW, CAN_RAW_FD_FRAMES, &canfx_on, sizeof(canfx_on));

		/* try to switch the socket into CAN XL mode */
		setsockopt(obj->s, SOL_CAN_RAW, CAN_RAW_XL_FRAMES, &canfx_on, sizeof(canfx_on));

		/* try to enable the CAN XL VCID pass through mode */
		setsockopt(obj->s, SOL_CAN_RAW, CAN_RAW_XL_VCID_OPTS, &vcid_opts, sizeof(vcid_opts));

		if (rcvbuf_size) {
			int curr_rcvbuf_size;
			socklen_t curr_rcvbuf_size_len = sizeof(curr_rcvbuf_size);

			/* try SO_RCVBUFFORCE first, if we run with CAP_NET_ADMIN */
			if (setsockopt(obj->s, SOL_SOCKET, SO_RCVBUFFORCE,
				       &rcvbuf_size, sizeof(rcvbuf_size)) < 0) {
				pr_debug("SO_RCVBUFFORCE failed so try SO_RCVBUF ...\n");
				if (setsockopt(obj->s, SOL_SOCKET, SO_RCVBUF,
					       &rcvbuf_size, sizeof(rcvbuf_size)) < 0) {
					perror("setsockopt SO_RCVBUF");
					return 1;
				}

				if (getsockopt(obj->s, SOL_SOCKET, SO_RCVBUF,
					       &curr_rcvbuf_size, &curr_rcvbuf_size_len) < 0) {
					perror("getsockopt SO_RCVBUF");
					return 1;
				}

				/* Only print a warning the first time we detect the adjustment */
				/* n.b.: The wanted size is doubled in Linux in net/sore/sock.c */
				if (!i && curr_rcvbuf_size < rcvbuf_size * 2)
					fprintf(stderr, "The socket receive buffer size was "
						"adjusted due to /proc/sys/net/core/rmem_max.\n");
			}
		}

		if (timestamp || log || logfrmt) {
			if (hwtimestamp) {
				const int timestamping_flags = (SOF_TIMESTAMPING_SOFTWARE |
								SOF_TIMESTAMPING_RX_SOFTWARE |
								SOF_TIMESTAMPING_RAW_HARDWARE);

				if (setsockopt(obj->s, SOL_SOCKET, SO_TIMESTAMPING,
					       &timestamping_flags, sizeof(timestamping_flags)) < 0) {
					perror("setsockopt SO_TIMESTAMPING is not supported by your Linux kernel");
					return 1;
				}
			} else {
				const int timestamp_on = 1;

				if (setsockopt(obj->s, SOL_SOCKET, SO_TIMESTAMP,
					       &timestamp_on, sizeof(timestamp_on)) < 0) {
					perror("setsockopt SO_TIMESTAMP");
					return 1;
				}
			}
		}

		if (dropmonitor) {
			const int dropmonitor_on = 1;

			if (setsockopt(obj->s, SOL_SOCKET, SO_RXQ_OVFL,
				       &dropmonitor_on, sizeof(dropmonitor_on)) < 0) {
				perror("setsockopt SO_RXQ_OVFL not supported by your Linux Kernel");
				return 1;
			}
		}

		if (bind(obj->s, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
			perror("bind");
			return 1;
		}
	}

	if (log) {
		if (!logname) {
			time_t currtime;
			struct tm now;

			if (time(&currtime) == (time_t)-1) {
				perror("time");
				return 1;
			}

			localtime_r(&currtime, &now);

			snprintf(fname, sizeof(fname), "candump-%04d-%02d-%02d_%02d%02d%02d.log",
				now.tm_year + 1900,
				now.tm_mon + 1,
				now.tm_mday,
				now.tm_hour,
				now.tm_min,
				now.tm_sec);

			logname = fname;
		}

		if (silent != SILENT_ON)
			fprintf(stderr, "Warning: Console output active while logging!\n");

		fprintf(stderr, "Enabling Logfile '%s'\n", logname);

		logfile = fopen(logname, "w");
		if (!logfile) {
			perror("logfile");
			return 1;
		}
	}

	/* these settings are static and can be held out of the hot path */
	iov.iov_base = &cu;
	msg.msg_name = &addr;
	msg.msg_iov = &iov;
	msg.msg_iovlen = 1;
	msg.msg_control = &ctrlmsg;

	while (running) {
		num_events = epoll_wait(fd_epoll, events_pending, currmax, timeout_ms);
		if (num_events == -1) {
			if (errno != EINTR)
				running = 0;
			continue;
		}

		/* handle timeout */
		if (!num_events && timeout_ms >= 0) {
			running = 0;
			continue;
		}

		for (i = 0; i < num_events; i++) { /* check waiting CAN RAW sockets */
			struct if_info *obj = events_pending[i].data.ptr;
			int idx;
			char *extra_info = "";

			/* these settings may be modified by recvmsg() */
			iov.iov_len = sizeof(cu);
			msg.msg_namelen = sizeof(addr);
			msg.msg_controllen = sizeof(ctrlmsg);
			msg.msg_flags = 0;

			nbytes = recvmsg(obj->s, &msg, 0);
			idx = idx2dindex(addr.can_ifindex, obj->s);

			if (nbytes < 0) {
				if ((errno == ENETDOWN) && !down_causes_exit) {
					fprintf(stderr, "%s: interface down\n", devname[idx]);
					continue;
				}
				perror("read");
				return 1;
			}

			/* mark dual-use struct canfd_frame */
			if (nbytes < (int)CANXL_HDR_SIZE + CANXL_MIN_DLEN) {
				fprintf(stderr, "read: no CAN frame\n");
				return 1;
			}

			if (cu.xl.flags & CANXL_XLF) {
				if (nbytes != (int)CANXL_HDR_SIZE + cu.xl.len) {
					printf("nbytes = %d\n", nbytes);
					fprintf(stderr, "read: no CAN XL frame\n");
					return 1;
				}
			} else {
				if (nbytes == CAN_MTU)
					cu.fd.flags = 0;
				else if (nbytes == CANFD_MTU)
					cu.fd.flags |= CANFD_FDF;
				else {
					fprintf(stderr, "read: incomplete CAN CC/FD frame\n");
					return 1;
				}
			}

			if (count && (--count == 0))
				running = 0;

			for (cmsg = CMSG_FIRSTHDR(&msg);
			     cmsg && (cmsg->cmsg_level == SOL_SOCKET);
			     cmsg = CMSG_NXTHDR(&msg,cmsg)) {
				if (cmsg->cmsg_type == SO_TIMESTAMP) {
					memcpy(&tv, CMSG_DATA(cmsg), sizeof(tv));
				} else if (cmsg->cmsg_type == SO_TIMESTAMPING) {
					struct timespec *stamp = (struct timespec *)CMSG_DATA(cmsg);

					/*
					 * stamp[0] is the software timestamp
					 * stamp[1] is deprecated
					 * stamp[2] is the raw hardware timestamp
					 * See chapter 2.1.2 Receive timestamps in
					 * linux/Documentation/networking/timestamping.txt
					 */
					tv.tv_sec = stamp[2].tv_sec;
					tv.tv_usec = stamp[2].tv_nsec / 1000;
				} else if (cmsg->cmsg_type == SO_RXQ_OVFL) {
					memcpy(&obj->dropcnt, CMSG_DATA(cmsg), sizeof(__u32));
				}
			}

			/* check for (unlikely) dropped frames on this specific socket */
			if (obj->dropcnt != obj->last_dropcnt) {
				__u32 frames = obj->dropcnt - obj->last_dropcnt;

				if (silent != SILENT_ON)
					printf("DROPCOUNT: dropped %u CAN frame%s on '%s' socket (total drops %u)\n",
					       frames, (frames > 1)?"s":"", devname[idx], obj->dropcnt);

				if (log)
					fprintf(logfile, "DROPCOUNT: dropped %u CAN frame%s on '%s' socket (total drops %u)\n",
						frames, (frames > 1)?"s":"", devname[idx], obj->dropcnt);

				obj->last_dropcnt = obj->dropcnt;
			}

			/* once we detected a EFF frame indent SFF frames accordingly */
			if (cu.fd.can_id & CAN_EFF_FLAG)
				view |= CANLIB_VIEW_INDENT_SFF;

			if (extra_msg_info) {
				if (msg.msg_flags & MSG_DONTROUTE)
					extra_info = " T";
				else
					extra_info = " R";
			}

			/* build common log format output */
			if ((log) || ((logfrmt) && (silent == SILENT_OFF))) {

				alen = sprint_timestamp(afrbuf, logtimestamp,
							  &tv, &last_tv);

				alen += sprintf(afrbuf + alen, "%*s ",
						  max_devname_len, devname[idx]);

				alen += snprintf_canframe(afrbuf + alen, sizeof(afrbuf) - alen, &cu, 0);
			}

			/* write CAN frame in log file style to logfile */
			if (log)
				fprintf(logfile, "%s%s\n", afrbuf, extra_info);

			/* print CAN frame in log file style to stdout */
			if ((logfrmt) && (silent == SILENT_OFF)) {
				printf("%s%s\n", afrbuf, extra_info);
				goto out_fflush; /* no other output to stdout */
			}

			/* print only animation */
			if (silent != SILENT_OFF) {
				if (silent == SILENT_ANI) {
					printf("%c\b", anichar[silentani %= MAXANI]);
					silentani++;
				}
				goto out_fflush; /* no other output to stdout */
			}

			/* print (colored) long CAN frame style to stdout */
			alen = sprintf(afrbuf, " %s", (color > 2) ? col_on[idx % MAXCOL] : "");
			alen += sprint_timestamp(afrbuf + alen, timestamp, &tv, &last_tv);
			alen += sprintf(afrbuf + alen, " %s%*s",
					  (color && (color < 3)) ? col_on[idx % MAXCOL] : "",
					  max_devname_len, devname[idx]);

			if (extra_msg_info) {
				if (msg.msg_flags & MSG_DONTROUTE)
					alen += sprintf(afrbuf + alen, "  TX %s",
							  extra_m_info[cu.fd.flags & 3]);
				else
					alen += sprintf(afrbuf + alen, "  RX %s",
							  extra_m_info[cu.fd.flags & 3]);
			}

			alen += sprintf(afrbuf + alen, "%s  ", (color == 1) ? col_off : "");
			alen += snprintf_long_canframe(afrbuf + alen, sizeof(afrbuf) - alen, &cu, view);

			if ((view & CANLIB_VIEW_ERROR) && (cu.fd.can_id & CAN_ERR_FLAG)) {
				alen += sprintf(afrbuf + alen, "\n\t");
				alen += snprintf_can_error_frame(afrbuf + alen,
								 sizeof(afrbuf) - alen,
								 &cu.fd, "\n\t");
			}

			printf("%s%s\n", afrbuf, (color > 1) ? col_off : "");
out_fflush:
			fflush(stdout);
		}
	}

	for (i = 0; i < currmax; i++)
		close(sock_info[i].s);

	close(fd_epoll);

	if (log)
		fclose(logfile);

	if (signal_num)
		return 128 + signal_num;

	return 0;
}